

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-read-partial-array.h
# Opt level: O0

int read_partial_array(coda_cursor *cursor,long offset,long length,void *dst)

{
  coda_dynamic_type_struct *pcVar1;
  coda_product_struct *pcVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long local_78;
  int64_t local_size;
  int64_t local_offset;
  int64_t target_offset;
  long num_values_per_block;
  long num_blocks;
  long i;
  long value_size;
  coda_netcdf_product *product;
  coda_netcdf_array *type;
  void *dst_local;
  long length_local;
  long offset_local;
  coda_cursor *cursor_local;
  
  pcVar1 = cursor->stack[cursor->n + -1].type;
  pcVar2 = cursor->product;
  lVar6 = *(long *)(*(long *)&(pcVar1[1].definition)->type_class + 0x20) >> 3;
  if ((int)(pcVar1[1].definition)->bit_size == 0) {
    iVar5 = read_bytes((coda_product *)pcVar2[1].filename,
                       (int64_t)((pcVar1[1].definition)->description + offset * lVar6),
                       length * lVar6,dst);
    if (iVar5 != 0) {
      return -1;
    }
  }
  else {
    pcVar3 = pcVar1->definition[1].description;
    lVar7 = *(long *)&pcVar1->definition[1].type_class / (long)pcVar3;
    local_offset = 0;
    for (num_blocks = 0; num_blocks < (long)pcVar3; num_blocks = num_blocks + 1) {
      local_size = 0;
      local_78 = lVar7;
      if (offset + length < (num_blocks + 1) * lVar7) {
        local_78 = (offset + length) - num_blocks * lVar7;
      }
      local_78 = local_78 * lVar6;
      if (num_blocks * lVar7 < offset) {
        local_size = (offset - num_blocks * lVar7) * lVar6;
        local_78 = local_78 - local_size;
      }
      iVar5 = read_bytes((coda_product *)pcVar2[1].filename,
                         (int64_t)((pcVar1[1].definition)->description +
                                  local_size + num_blocks * *(long *)&pcVar2[1].format),local_78,
                         (void *)((long)dst + local_offset));
      if (iVar5 != 0) {
        return -1;
      }
      local_offset = local_78 + local_offset;
    }
  }
  lVar6 = *(long *)(*(long *)&(pcVar1[1].definition)->type_class + 0x20);
  if (lVar6 != 8) {
    if (lVar6 == 0x10) {
      for (num_blocks = 0; lVar6._0_4_ = pcVar1->definition[1].type_class,
          lVar6._4_4_ = pcVar1->definition[1].read_type, num_blocks < lVar6;
          num_blocks = num_blocks + 1) {
        swap2((void *)((long)dst + num_blocks * 2));
      }
    }
    else if (lVar6 == 0x20) {
      for (num_blocks = 0; lVar7._0_4_ = pcVar1->definition[1].type_class,
          lVar7._4_4_ = pcVar1->definition[1].read_type, num_blocks < lVar7;
          num_blocks = num_blocks + 1) {
        swap4((void *)((long)dst + num_blocks * 4));
      }
    }
    else {
      if (lVar6 != 0x40) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf-cursor.c"
                      ,0x15b,"int read_partial_array(const coda_cursor *, long, long, void *)");
      }
      for (num_blocks = 0; lVar4._0_4_ = pcVar1->definition[1].type_class,
          lVar4._4_4_ = pcVar1->definition[1].read_type, num_blocks < lVar4;
          num_blocks = num_blocks + 1) {
        swap8((void *)((long)dst + num_blocks * 8));
      }
    }
  }
  return 0;
}

Assistant:

static int read_partial_array(const coda_cursor *cursor, read_function read_basic_type_function, long offset,
                              long length, uint8_t *dst, int basic_type_size)
{
    coda_cursor array_cursor;
    int i;

    array_cursor = *cursor;

    if (length > 0)
    {
        if (coda_cursor_goto_array_element_by_index(&array_cursor, offset) != 0)
        {
            return -1;
        }
        for (i = 0; i < length; i++)
        {
            if ((*read_basic_type_function)(&array_cursor, &dst[i * basic_type_size]) != 0)
            {
                return -1;
            }
            if (i < length - 1)
            {
                if (coda_cursor_goto_next_array_element(&array_cursor) != 0)
                {
                    return -1;
                }
            }
        }
    }

    return 0;
}